

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementLabel.cpp
# Opt level: O1

void __thiscall Rml::ElementLabel::ProcessEvent(ElementLabel *this,Event *event)

{
  bool bVar1;
  EventPhase EVar2;
  Element *this_00;
  Element *element;
  
  bVar1 = Event::operator==(event,Click);
  if ((bVar1) && (this->disable_click == false)) {
    EVar2 = Event::GetPhase(event);
    if ((EVar2 != Capture) && (EVar2 = Event::GetPhase(event), EVar2 != Target)) {
      return;
    }
    this_00 = GetTarget(this);
    if (this_00 != (Element *)0x0) {
      element = Event::GetTargetElement(event);
      bVar1 = Element::Contains(this_00,element);
      if (!bVar1) {
        this->disable_click = true;
        Event::StopPropagation(event);
        Element::Focus(this_00,false);
        Element::Click(this_00);
        this->disable_click = false;
      }
    }
  }
  return;
}

Assistant:

void ElementLabel::ProcessEvent(Event& event)
{
	// Forward clicks to the target.
	if (event == EventId::Click && !disable_click)
	{
		if (event.GetPhase() == EventPhase::Capture || event.GetPhase() == EventPhase::Target)
		{
			if (Element* label_target = GetTarget())
			{
				Element* event_target = event.GetTargetElement();
				// If the event is already on the way to the label target, there is no reason to intervene with the
				// click. Just let the event move down the chain without interrupting it. Otherwise, intervene to
				// manually redirect the click to the label target.
				if (!label_target->Contains(event_target))
				{
					// Temporarily disable click captures to avoid infinite recursion in case this element is on the path to the target element.
					disable_click = true;
					event.StopPropagation();
					label_target->Focus();
					label_target->Click();
					disable_click = false;
				}
			}
		}
	}
}